

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_statement.cpp
# Opt level: O1

string * __thiscall
duckdb::MultiStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,MultiStatement *this)

{
  pointer puVar1;
  long lVar2;
  pointer pSVar3;
  long *plVar4;
  size_type *psVar5;
  pointer this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  stringified;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_88.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->statements).
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->statements).
           super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != puVar1) {
    do {
      pSVar3 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(this_00);
      (*pSVar3->_vptr_SQLStatement[2])(&local_70,pSVar3);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,";","");
  StringUtil::Join((string *)&local_70,&local_88,&local_50);
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

string MultiStatement::ToString() const {
	vector<string> stringified;
	for (auto &stmt : statements) {
		stringified.push_back(stmt->ToString());
	}
	return StringUtil::Join(stringified, ";") + ";";
}